

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b::SolverDpllTriadSimd<0>::CountSolutionsConsistentWithPartialAssignment
          (SolverDpllTriadSimd<0> *this,State *state)

{
  long in_RDI;
  pair<unsigned_int,_Bitvec08x16> band_and_value;
  State *in_stack_000001b8;
  State *in_stack_00000200;
  Cells08 *in_stack_00000208;
  int in_stack_00000214;
  SolverDpllTriadSimd<0> *in_stack_00000218;
  undefined4 local_38;
  
  ChooseBandAndValueToBranch(in_stack_000001b8);
  if (local_38 == 0xffffffff) {
    *(long *)(in_RDI + 0x1e8) = *(long *)(in_RDI + 0x1e8) + 1;
  }
  else if (local_38 < 3) {
    BranchOnBandAndValue<0>(in_stack_00000218,in_stack_00000214,in_stack_00000208,in_stack_00000200)
    ;
  }
  else {
    BranchOnBandAndValue<1>(in_stack_00000218,in_stack_00000214,in_stack_00000208,in_stack_00000200)
    ;
  }
  return;
}

Assistant:

void CountSolutionsConsistentWithPartialAssignment(State &state) {
        auto band_and_value = ChooseBandAndValueToBranch(state);
        if (band_and_value.first == NONE) {
            num_solutions_++;
            if (solution_mode == 1 && num_solutions_ == limit_) solution_ = state;
            if (solution_mode == 2) ReportSolution(state);
        } else {
            if (band_and_value.first < 3) {
                BranchOnBandAndValue<0>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            } else {
                BranchOnBandAndValue<1>(
                        tables.mod3[band_and_value.first], band_and_value.second, state);
            }
        }
    }